

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_crypt.cc
# Opt level: O3

int rsa_padding_add_PKCS1_type_2(uint8_t *to,size_t to_len,uint8_t *from,size_t from_len)

{
  uchar *buf;
  int reason;
  long lVar1;
  int line;
  long lVar2;
  
  if (to_len < 0xb) {
    reason = 0x7e;
    line = 0xe0;
  }
  else {
    if (from_len <= to_len - 0xb) {
      to[0] = '\0';
      to[1] = '\x02';
      buf = to + 2;
      RAND_bytes(buf,(int)(to_len - 3) - (int)from_len);
      lVar2 = (to_len - 3) - from_len;
      if (lVar2 == 0) {
        to[2] = '\0';
      }
      else {
        lVar1 = 0;
        do {
          if (buf[lVar1] == '\0') {
            do {
              RAND_bytes(buf + lVar1,1);
            } while (buf[lVar1] == '\0');
          }
          lVar1 = lVar1 + 1;
        } while (lVar1 != lVar2);
        to[lVar2 + 2] = '\0';
        if (from_len == 0) {
          return 1;
        }
      }
      memcpy(to + (to_len - from_len),from,from_len);
      return 1;
    }
    reason = 0x72;
    line = 0xe5;
  }
  ERR_put_error(4,0,reason,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rsa/rsa_crypt.cc"
                ,line);
  return 0;
}

Assistant:

static int rsa_padding_add_PKCS1_type_2(uint8_t *to, size_t to_len,
                                        const uint8_t *from, size_t from_len) {
  // See RFC 8017, section 7.2.1.
  if (to_len < RSA_PKCS1_PADDING_SIZE) {
    OPENSSL_PUT_ERROR(RSA, RSA_R_KEY_SIZE_TOO_SMALL);
    return 0;
  }

  if (from_len > to_len - RSA_PKCS1_PADDING_SIZE) {
    OPENSSL_PUT_ERROR(RSA, RSA_R_DATA_TOO_LARGE_FOR_KEY_SIZE);
    return 0;
  }

  to[0] = 0;
  to[1] = 2;

  size_t padding_len = to_len - 3 - from_len;
  rand_nonzero(to + 2, padding_len);
  to[2 + padding_len] = 0;
  OPENSSL_memcpy(to + to_len - from_len, from, from_len);
  return 1;
}